

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O1

void density::detail::
     LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
     ::commit_put_impl(Allocation *i_put)

{
  if ((0xf < (i_put->m_control_block->m_next ^ i_put->m_next_ptr)) || ((i_put->m_next_ptr & 3) != 1)
     ) {
    density_tests::detail::assert_failed<>
              ("(i_put.m_next_ptr & ~LfQueue_AllFlags) == (raw_atomic_load(&i_put.m_control_block->m_next, mem_relaxed) & ~LfQueue_AllFlags) && (i_put.m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Busy"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_base.h"
               ,0x1a3);
  }
  LOCK();
  i_put->m_control_block->m_next = i_put->m_next_ptr - 1;
  UNLOCK();
  return;
}

Assistant:

static void commit_put_impl(const Allocation & i_put) noexcept
            {
                // we expect to have LfQueue_Busy and not LfQueue_Dead
                DENSITY_ASSUME_ALIGNED(i_put.m_control_block, s_alloc_granularity);
                DENSITY_ASSERT_INTERNAL(
                  (i_put.m_next_ptr & ~LfQueue_AllFlags) ==
                    (raw_atomic_load(&i_put.m_control_block->m_next, mem_relaxed) &
                     ~LfQueue_AllFlags) &&
                  (i_put.m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Busy);

                // remove the flag LfQueue_Busy
                raw_atomic_store(
                  &i_put.m_control_block->m_next, i_put.m_next_ptr - LfQueue_Busy, mem_release);
            }